

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFboCompletenessTests.cpp
# Opt level: O3

void __thiscall deqp::gles2::Functional::TestGroup::TestGroup(TestGroup *this,Context *ctx)

{
  Context *this_00;
  bool bVar1;
  FormatEntries fmtRange;
  FormatExtEntries extRange;
  
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)this,ctx->m_testCtx,"completeness","Completeness tests");
  (this->super_TestCaseGroup).m_context = ctx;
  (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestGroup_0077c828;
  (this->m_checkerFactory).super_CheckerFactory._vptr_CheckerFactory =
       (_func_int **)&PTR_createChecker_0077c8f8;
  this_00 = &this->m_fboc;
  deqp::gls::fboc::details::Context::Context
            (this_00,ctx->m_testCtx,ctx->m_renderCtx,&(this->m_checkerFactory).super_CheckerFactory)
  ;
  fmtRange.m_end =
       (Pair<deqp::gls::FboUtil::FormatFlags,_deqp::gls::Range<unsigned_int>_> *)s_es2ExtFormats;
  fmtRange.m_begin =
       (Pair<deqp::gls::FboUtil::FormatFlags,_deqp::gls::Range<unsigned_int>_> *)s_es2Formats;
  deqp::gls::fboc::details::Context::addFormats(this_00,fmtRange);
  extRange.m_end = (FormatExtEntry *)&ES2Checker::vtable;
  extRange.m_begin = (FormatExtEntry *)s_es2ExtFormats;
  deqp::gls::fboc::details::Context::addExtFormats(this_00,extRange);
  bVar1 = glu::ContextInfo::isExtensionSupported(ctx->m_contextInfo,"GL_NV_fbo_color_attachments");
  (this->m_fboc).m_haveMultiColorAtts = bVar1;
  return;
}

Assistant:

TestGroup::TestGroup (Context& ctx)
	: TestCaseGroup		(ctx, "completeness", "Completeness tests")
	, m_checkerFactory	()
	, m_fboc			(ctx.getTestContext(), ctx.getRenderContext(), m_checkerFactory)
{
	const FormatEntries stdRange = GLS_ARRAY_RANGE(s_es2Formats);
	const FormatExtEntries extRange = GLS_ARRAY_RANGE(s_es2ExtFormats);

	m_fboc.addFormats(stdRange);
	m_fboc.addExtFormats(extRange);
	m_fboc.setHaveMulticolorAtts(
		ctx.getContextInfo().isExtensionSupported("GL_NV_fbo_color_attachments"));
}